

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene::SerializeWithCachedSizes
          (VisionFeaturePrint_Scene *this,CodedOutputStream *output)

{
  VisionFeaturePrint_Scene_SceneVersion VVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  VisionFeaturePrint_Scene *this_local;
  
  VVar1 = version(this);
  if (VVar1 != VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_INVALID) {
    VVar1 = version(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,VVar1,output);
  }
  return;
}

Assistant:

void VisionFeaturePrint_Scene::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene.SceneVersion version = 1;
  if (this->version() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->version(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene)
}